

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

string * __thiscall
cmInstallCommand::GetLocalStateDestination_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallCommand *this,cmInstallCommandArguments *args)

{
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmInstallCommandArguments *local_20;
  cmInstallCommandArguments *args_local;
  cmInstallCommand *this_local;
  
  local_20 = args;
  args_local = (cmInstallCommandArguments *)this;
  this_local = (cmInstallCommand *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_INSTALL_LOCALSTATEDIR",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"var",&local_79);
  GetDestination(__return_storage_ptr__,this,args,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCommand::GetLocalStateDestination(
  const cmInstallCommandArguments* args)
{
  return this->GetDestination(args, "CMAKE_INSTALL_LOCALSTATEDIR", "var");
}